

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O3

Intersectors * __thiscall
embree::BVH4Factory::BVH4GridIntersectors
          (Intersectors *__return_storage_ptr__,BVH4Factory *this,BVH4 *bvh,
          IntersectVariant ivariant)

{
  Intersector16 local_48;
  
  (__return_storage_ptr__->collider).name = (char *)0x0;
  (__return_storage_ptr__->intersector1).intersect = (IntersectFunc)0x0;
  __return_storage_ptr__->leafIntersector = (void *)0x0;
  (__return_storage_ptr__->collider).collide = (CollideFunc)0x0;
  (__return_storage_ptr__->intersector1).occluded = (OccludedFunc)0x0;
  memset(&(__return_storage_ptr__->intersector1).name,0,0xe0);
  __return_storage_ptr__->ptr = &bvh->super_AccelData;
  if (ivariant == FAST) {
    (*this->BVH4GridIntersector1Moeller)(&__return_storage_ptr__->intersector1);
    (*this->BVH4GridIntersector4HybridMoeller)((Intersector4 *)&local_48);
    (__return_storage_ptr__->intersector4).name = local_48.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).intersect = local_48.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).intersect + 4) =
         local_48.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).occluded = local_48.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).occluded + 4) =
         local_48.occluded._4_4_;
    (*this->BVH4GridIntersector8HybridMoeller)((Intersector8 *)&local_48);
    (__return_storage_ptr__->intersector8).name = local_48.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).intersect = local_48.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).intersect + 4) =
         local_48.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).occluded = local_48.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).occluded + 4) =
         local_48.occluded._4_4_;
    (*this->BVH4GridIntersector16HybridMoeller)(&local_48);
  }
  else {
    (*this->BVH4GridIntersector1Pluecker)(&__return_storage_ptr__->intersector1);
    (*this->BVH4GridIntersector4HybridPluecker)((Intersector4 *)&local_48);
    (__return_storage_ptr__->intersector4).name = local_48.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).intersect = local_48.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).intersect + 4) =
         local_48.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).occluded = local_48.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).occluded + 4) =
         local_48.occluded._4_4_;
    (*this->BVH4GridIntersector8HybridPluecker)((Intersector8 *)&local_48);
    (__return_storage_ptr__->intersector8).name = local_48.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).intersect = local_48.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).intersect + 4) =
         local_48.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).occluded = local_48.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).occluded + 4) =
         local_48.occluded._4_4_;
    (*this->BVH4GridIntersector16HybridPluecker)(&local_48);
  }
  (__return_storage_ptr__->intersector16).name = local_48.name;
  (__return_storage_ptr__->intersector16).intersect =
       (IntersectFunc16)CONCAT44(local_48.intersect._4_4_,local_48.intersect._0_4_);
  (__return_storage_ptr__->intersector16).occluded =
       (OccludedFunc16)CONCAT44(local_48.occluded._4_4_,local_48.occluded._0_4_);
  return __return_storage_ptr__;
}

Assistant:

Accel::Intersectors BVH4Factory::BVH4GridIntersectors(BVH4* bvh, IntersectVariant ivariant)
  {
    Accel::Intersectors intersectors;
    intersectors.ptr = bvh;
    if (ivariant == IntersectVariant::FAST)
    {
      intersectors.intersector1  = BVH4GridIntersector1Moeller();
#if defined (EMBREE_RAY_PACKETS)
      intersectors.intersector4  = BVH4GridIntersector4HybridMoeller();
      intersectors.intersector8  = BVH4GridIntersector8HybridMoeller();
      intersectors.intersector16 = BVH4GridIntersector16HybridMoeller();
#endif
    }
    else /* if (ivariant == IntersectVariant::ROBUST) */
    {
      intersectors.intersector1  = BVH4GridIntersector1Pluecker();
#if defined (EMBREE_RAY_PACKETS)
      intersectors.intersector4  = BVH4GridIntersector4HybridPluecker();
      intersectors.intersector8  = BVH4GridIntersector8HybridPluecker();
      intersectors.intersector16 = BVH4GridIntersector16HybridPluecker();
#endif      
    }
    return intersectors;
  }